

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Emu.cpp
# Opt level: O0

int __thiscall Hes_Emu::cpu_done(Hes_Emu *this)

{
  time_t tVar1;
  time_t *in_RSI;
  Hes_Emu *in_RDI;
  hes_time_t present;
  
  if (((in_RDI->super_Hes_Cpu).r.status & 4) == 0) {
    tVar1 = Hes_Cpu::time(&in_RDI->super_Hes_Cpu,in_RSI);
    if (((in_RDI->irq).timer <= (int)tVar1) && (((in_RDI->irq).disables & 4) == 0)) {
      (in_RDI->timer).fired = '\x01';
      (in_RDI->irq).timer = 0x40000000;
      irq_changed(in_RDI);
      return 10;
    }
    if (((in_RDI->irq).vdp <= (int)tVar1) && (((in_RDI->irq).disables & 2) == 0)) {
      return 8;
    }
  }
  return 0;
}

Assistant:

int Hes_Emu::cpu_done()
{
	check( time() >= end_time() ||
			(!(r.status & i_flag_mask) && time() >= irq_time()) );
	
	if ( !(r.status & i_flag_mask) )
	{
		hes_time_t present = time();
		
		if ( irq.timer <= present && !(irq.disables & timer_mask) )
		{
			timer.fired = true;
			irq.timer = future_hes_time;
			irq_changed(); // overkill, but not worth writing custom code
			#if GME_FRAME_HOOK_DEFINED
			{
				unsigned const threshold = period_60hz / 30;
				unsigned long elapsed = present - last_frame_hook;
				if ( elapsed - period_60hz + threshold / 2 < threshold )
				{
					last_frame_hook = present;
					GME_FRAME_HOOK( this );
				}
			}
			#endif
			return 0x0A;
		}
		
		if ( irq.vdp <= present && !(irq.disables & vdp_mask) )
		{
			// work around for bugs with music not acknowledging VDP
			//run_until( present );
			//irq.vdp = future_hes_time;
			//irq_changed();
			#if GME_FRAME_HOOK_DEFINED
				last_frame_hook = present;
				GME_FRAME_HOOK( this );
			#endif
			return 0x08;
		}
	}
	return 0;
}